

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O1

int __thiscall DetectorSS::Estimate(DetectorSS *this,int bucket,uchar *bmp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined8 in_XMM2_Qb;
  int local_4c;
  ulong local_48;
  undefined1 extraout_var [56];
  
  lVar3 = (long)(this->ss_).c;
  iVar4 = bucket * (this->ss_).offsets[lVar3];
  if (lVar3 < 2) {
    uVar7 = 0;
    iVar6 = 1;
  }
  else {
    iVar6 = 1;
    uVar7 = 0;
    do {
      iVar5 = (this->ss_).offsets[uVar7] + iVar4;
      iVar5 = countzerobits(bmp,iVar5,(this->ss_).b + iVar5);
      if ((this->ss_).b - iVar5 <= (this->ss_).setmax) break;
      iVar6 = iVar6 * 2;
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)(this->ss_).c + -1);
  }
  local_4c = (int)uVar7 + -1;
  iVar5 = (this->ss_).c + -1;
  if ((int)uVar7 < iVar5) {
    uVar8 = uVar7 & 0xffffffff;
    local_48 = 0;
    do {
      iVar5 = (this->ss_).offsets[uVar8] + iVar4;
      iVar5 = countzerobits(bmp,iVar5,(this->ss_).b + iVar5);
      dVar9 = (double)(this->ss_).b;
      dVar10 = log(dVar9);
      dVar11 = log((double)iVar5);
      if ((iVar5 == 0) || ((this->ss_).setmax < (this->ss_).b - iVar5)) {
        local_48 = 0;
        local_4c = (int)uVar8;
      }
      else {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_48;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = dVar9;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar10 - dVar11;
        auVar2 = vfmadd231sd_fma(auVar17,auVar12,auVar2);
        local_48 = auVar2._0_8_;
      }
      uVar8 = uVar8 + 1;
      iVar5 = (this->ss_).c + -1;
    } while ((int)uVar8 < iVar5);
  }
  else {
    local_48 = 0;
  }
  iVar4 = iVar4 + (this->ss_).offsets[iVar5];
  iVar4 = countzerobits(bmp,iVar4,(this->ss_).lastb + iVar4);
  auVar14._0_8_ = (double)(this->ss_).lastb;
  auVar16._0_8_ = log(auVar14._0_8_);
  auVar16._8_56_ = extraout_var;
  auVar13 = auVar16._0_16_;
  if (iVar4 != 0) {
    dVar9 = log((double)iVar4);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auVar16._0_8_ - dVar9;
  }
  auVar14._8_8_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_48;
  auVar2 = vfmadd213sd_fma(auVar13,auVar14,auVar1);
  auVar15._0_8_ = (double)(iVar6 << ((byte)(((char)local_4c - (char)uVar7) + 1) & 0x1f));
  auVar15._8_8_ = in_XMM2_Qb;
  auVar2 = vfmadd213sd_fma(auVar15,auVar2,ZEXT816(0x3fe0000000000000));
  return (int)auVar2._0_8_;
}

Assistant:

int DetectorSS::Estimate(int bucket, unsigned char* bmp) {
	int offs = bucket * ss_.offsets[ss_.c];
	int z, tmpoff = 0, base;
	double m;
	int factor = 1;
	for (base = 0; base < ss_.c - 1; base++) {
		tmpoff = offs + ss_.offsets[base];
		z = countzerobits(bmp, tmpoff, tmpoff + ss_.b);
		//TL: if the bitmap is not full
		if (ss_.b - z <= ss_.setmax) {
			break;
		}
		else {
			factor = factor * 2;
		}
	}
	m = 0;

	int pos = base - 1;
	for (int i = base; i < ss_.c - 1; i++) {
		tmpoff = offs + ss_.offsets[i];
		z = countzerobits(bmp, tmpoff, tmpoff + ss_.b);
		m += ss_.b * (log(ss_.b) - log(z));
		if (z == 0 || ss_.b - z > ss_.setmax) {
			pos = i;
			m = 0;
		}
	}
	factor = factor * (1 << (pos - base + 1));

	tmpoff = offs + ss_.offsets[ss_.c - 1];
	z = countzerobits(bmp, tmpoff, tmpoff + ss_.lastb);
	if (z == 0) {
		m += ss_.lastb * (log(ss_.lastb));
	}
	else {
		m += ss_.lastb * (log(ss_.lastb) - log(z));
	}
	return (int)(factor * m + 0.5);
}